

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O3

void __thiscall
Lib::
SkipList<Inferences::ALASCA::Demodulation::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::LDComparator>
::remove<Inferences::ALASCA::Demodulation::Rhs>
          (SkipList<Inferences::ALASCA::Demodulation::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::LDComparator>
           *this,Rhs key)

{
  Node *ld2;
  Comparison CVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  Node *pNVar5;
  uint uVar6;
  Node *pNVar7;
  ulong uVar8;
  Node *pNVar9;
  
  pNVar9 = this->_left;
  uVar6 = this->_top;
LAB_0030aeaf:
  uVar6 = uVar6 - 1;
  pNVar5 = pNVar9;
  do {
    pNVar9 = pNVar5;
    uVar3 = (ulong)uVar6;
    while( true ) {
      pNVar5 = pNVar9->nodes[uVar3];
      if ((pNVar5 == (Node *)0x0) ||
         (CVar1 = Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::LDComparator::
                  compare<Inferences::ALASCA::Demodulation::Rhs>(&key,&pNVar5->value), CVar1 == LESS
         )) goto LAB_0030aeaf;
      if (CVar1 == GREATER) break;
      if (CVar1 == EQUAL) {
        ld2 = pNVar5->nodes[0];
        pNVar7 = pNVar5;
        if (uVar6 == 0) {
          pNVar9->nodes[0] = ld2;
          goto LAB_0030af6c;
        }
        if (((ld2 != (Node *)0x0) && (pNVar5->nodes[uVar3] != ld2)) &&
           (CVar1 = Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::LDComparator
                    ::compare<Inferences::ALASCA::Demodulation::Rhs>(&key,&ld2->value),
           CVar1 == EQUAL)) {
          pNVar7 = pNVar5->nodes[0];
          uVar6 = 0xffffffff;
          do {
            uVar4 = uVar6 + 2;
            uVar6 = uVar6 + 1;
          } while (pNVar7 == pNVar5->nodes[uVar4]);
          uVar3 = (ulong)uVar6;
          pNVar5->nodes[uVar3] = pNVar7->nodes[uVar3];
          pNVar9 = pNVar5;
          uVar8 = uVar3;
          if (uVar6 != 0) {
LAB_0030af12:
            do {
              uVar2 = uVar3 - 1;
              do {
                pNVar5 = pNVar9;
                pNVar9 = pNVar5->nodes[uVar3 - 1];
              } while (pNVar5->nodes[uVar3 - 1] != pNVar7);
              pNVar5->nodes[uVar3 - 1] = pNVar7->nodes[uVar3 - 1];
              uVar3 = uVar2;
              pNVar9 = pNVar5;
            } while (uVar2 != 0);
            uVar3 = uVar8 * 8 + 0x37 & 0xffffffff0;
            if (uVar3 == 0) {
              (pNVar7->value).term.super_TermList._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
              GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pNVar7;
              return;
            }
            if (uVar3 < 0x11) {
              (pNVar7->value).term.super_TermList._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
              GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pNVar7;
              return;
            }
            if (uVar3 < 0x19) {
              (pNVar7->value).term.super_TermList._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
              GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pNVar7;
              return;
            }
            if (uVar3 < 0x21) {
              (pNVar7->value).term.super_TermList._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
              GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pNVar7;
              return;
            }
            if (0x30 < uVar3) {
              if (uVar3 < 0x41) {
                (pNVar7->value).term.super_TermList._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_
                ;
                GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pNVar7;
                return;
              }
              operator_delete(pNVar7,0x10);
              return;
            }
          }
LAB_0030af6c:
          (pNVar7->value).term.super_TermList._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pNVar7;
          return;
        }
        pNVar9->nodes[uVar3] = pNVar5->nodes[uVar3];
        uVar8 = uVar3;
        goto LAB_0030af12;
      }
    }
  } while( true );
}

Assistant:

void remove(Key key)
  {
    ASS(_top > 0);

    Node* found = 0; // found node
#if VDEBUG
    unsigned foundHeight = 0; // its height
#else
    unsigned foundHeight; // its height
#endif

    Node* left = _left;
    unsigned h = _top-1;
    for (;;) {
      Node* next = left->nodes[h];
      if (next == 0) {
	ASS(h != 0); //this would mean that the value is not present in the list
	h--;
	continue;
      }
      // next != 0
      switch (ValueComparator::compare(key,next->value))
	{
	case LESS:
	  ASS(h != 0);
	  h--;
	  break;

	case GREATER:
	  left = next;
	  break;

	case EQUAL:
	  found = next;
	  foundHeight = h;
	  if(h>0 && found->nodes[0] && found->nodes[h]!=found->nodes[0] &&
		  ValueComparator::compare(key,found->nodes[0]->value)==EQUAL) {
	    //The next element exists, contains the same value,
	    //and its height is lower that the height of this one.
	    //We'll rather delete that one, than the one we've found,
	    //because otherwise there'd be only low elements after a few
	    //deletions, which would degrade the skip list to linked list.
	    h=0;
	    while(found->nodes[0]==found->nodes[h+1]) {
	      h++;
	    }
	    left = found;
	    found = found->nodes[0];
	    foundHeight = h;
	  }
	  for(;;) {
	    left->nodes[h] = found->nodes[h];
	    if(h==0) {
	      break;
	    }
	    h--;
	    while(left->nodes[h]!=found) {
	      left=left->nodes[h];
	      ASS(ValueComparator::compare(key,left->value)!=LESS);
	    }
	  }

	  deallocate(found,foundHeight);
	  return;

#if VDEBUG
	default:
	  ASSERTION_VIOLATION;
#endif
	}
    }
  }